

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  size_t len;
  ulong uVar5;
  
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    puVar1 = buf->base;
    sVar2 = buf->off;
    (puVar1 + sVar2)[0] = '\0';
    (puVar1 + sVar2)[1] = '\0';
    sVar2 = buf->off;
    buf->off = sVar2 + 2;
    iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
    if (iVar4 == 0) {
      buf->base[buf->off] = '\0';
      buf->off = buf->off + 1;
      iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
      if (iVar4 == 0) {
        puVar1 = buf->base;
        sVar3 = buf->off;
        (puVar1 + sVar3)[0] = '\0';
        (puVar1 + sVar3)[1] = '\0';
        sVar3 = buf->off;
        buf->off = sVar3 + 2;
        len = strlen(server_name);
        iVar4 = ptls_buffer__do_pushv(buf,server_name,len);
        if (iVar4 == 0) {
          uVar5 = buf->off - (sVar3 + 2);
          iVar4 = 0x20c;
          if (uVar5 < 0x10000) {
            buf->base[sVar3] = (uint8_t)(uVar5 >> 8);
            buf->base[sVar3 + 1] = (uint8_t)uVar5;
            uVar5 = buf->off - (sVar2 + 2);
            if (uVar5 < 0x10000) {
              buf->base[sVar2] = (uint8_t)(uVar5 >> 8);
              buf->base[sVar2 + 1] = (uint8_t)uVar5;
              iVar4 = 0;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}